

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O3

void tcg_gen_gvec_2_mips(TCGContext_conflict3 *tcg_ctx,uint32_t dofs,uint32_t aofs,uint32_t oprsz,
                        uint32_t maxsz,GVecGen2_conflict3 *g)

{
  byte bVar1;
  _func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_conflict3 *p_Var2;
  _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_conflict3 *p_Var3;
  TCGType_conflict TVar4;
  TCGTemp *pTVar5;
  uintptr_t o;
  TCGv_i64 pTVar6;
  TCGv_i32 pTVar7;
  uint uVar8;
  uint32_t uVar9;
  _func_void_TCGContext_ptr_uint_TCGv_vec_TCGv_vec_conflict3 *fni;
  
  if (g->fniv == (_func_void_TCGContext_ptr_uint_TCGv_vec_TCGv_vec_conflict3 *)0x0) {
switchD_007ae39a_caseD_0:
    if (((oprsz - 8 < 0x20) && ((oprsz & 7) == 0)) &&
       (p_Var2 = g->fni8, p_Var2 != (_func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_conflict3 *)0x0)) {
      uVar8 = 0;
      pTVar5 = tcg_temp_new_internal_mips(tcg_ctx,TCG_TYPE_I64,false);
      pTVar6 = (TCGv_i64)((long)pTVar5 - (long)tcg_ctx);
      do {
        tcg_gen_op3_mips(tcg_ctx,INDEX_op_ld_i64,(TCGArg)pTVar5,
                         (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(uVar8 + aofs));
        (*p_Var2)(tcg_ctx,pTVar6,pTVar6);
        tcg_gen_op3_mips(tcg_ctx,INDEX_op_st_i64,(TCGArg)pTVar5,
                         (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(dofs + uVar8));
        uVar8 = uVar8 + 8;
      } while (uVar8 < oprsz);
      tcg_temp_free_internal_mips(tcg_ctx,(TCGTemp *)(pTVar6 + (long)tcg_ctx));
    }
    else {
      if (((0xf < oprsz - 4) || ((oprsz & 3) != 0)) ||
         (p_Var3 = g->fni4, p_Var3 == (_func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_conflict3 *)0x0))
      {
        if (g->fno != (gen_helper_gvec_2_conflict3 *)0x0) {
          tcg_gen_gvec_2_ool_mips(tcg_ctx,dofs,aofs,oprsz,maxsz,g->data,g->fno);
          return;
        }
        __assert_fail("g->fno != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
                      ,0x42f,
                      "void tcg_gen_gvec_2_mips(TCGContext *, uint32_t, uint32_t, uint32_t, uint32_t, const GVecGen2 *)"
                     );
      }
      uVar8 = 0;
      pTVar5 = tcg_temp_new_internal_mips(tcg_ctx,TCG_TYPE_I32,false);
      pTVar7 = (TCGv_i32)((long)pTVar5 - (long)tcg_ctx);
      do {
        tcg_gen_op3_mips(tcg_ctx,INDEX_op_ld_i32,(TCGArg)pTVar5,
                         (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(aofs + uVar8));
        (*p_Var3)(tcg_ctx,pTVar7,pTVar7);
        tcg_gen_op3_mips(tcg_ctx,INDEX_op_st_i32,(TCGArg)pTVar5,
                         (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(uVar8 + dofs));
        uVar8 = uVar8 + 4;
      } while (uVar8 < oprsz);
      tcg_temp_free_internal_mips(tcg_ctx,(TCGTemp *)(pTVar7 + (long)tcg_ctx));
    }
  }
  else {
    TVar4 = choose_vector_type(tcg_ctx,g->opt_opc,(uint)g->vece,oprsz,g->prefer_i64);
    switch(TVar4) {
    case TCG_TYPE_I32:
      goto switchD_007ae39a_caseD_0;
    default:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
                 ,0x436,(char *)0x0);
    case TCG_TYPE_V64:
      bVar1 = g->vece;
      uVar9 = 8;
      fni = g->fniv;
      TVar4 = TCG_TYPE_V64;
      break;
    case TCG_TYPE_V256:
      uVar8 = oprsz & 0xffffffe0;
      expand_2_vec(tcg_ctx,(uint)g->vece,dofs,aofs,uVar8,0x20,TCG_TYPE_V256,g->fniv);
      if (uVar8 == oprsz) goto LAB_007ae5f6;
      dofs = dofs + uVar8;
      aofs = aofs + uVar8;
      oprsz = oprsz & 0x1f;
      maxsz = maxsz - uVar8;
    case TCG_TYPE_V128:
      bVar1 = g->vece;
      uVar9 = 0x10;
      fni = g->fniv;
      TVar4 = TCG_TYPE_V128;
    }
    expand_2_vec(tcg_ctx,(uint)bVar1,dofs,aofs,oprsz,uVar9,TVar4,fni);
  }
LAB_007ae5f6:
  uVar9 = maxsz - oprsz;
  if (oprsz <= maxsz && uVar9 != 0) {
    do_dup(tcg_ctx,0,dofs + oprsz,uVar9,uVar9,(TCGv_i32)0x0,(TCGv_i64)0x0,0);
  }
  return;
}

Assistant:

void tcg_gen_gvec_2(TCGContext *tcg_ctx, uint32_t dofs, uint32_t aofs,
                    uint32_t oprsz, uint32_t maxsz, const GVecGen2 *g)
{
    const TCGOpcode *this_list = g->opt_opc ? g->opt_opc : vecop_list_empty;
    const TCGOpcode *hold_list = tcg_swap_vecop_list(this_list);
    TCGType type;
    uint32_t some;

    check_size_align(oprsz, maxsz, dofs | aofs);
    check_overlap_2(dofs, aofs, maxsz);

    type = 0;
    if (g->fniv) {
        type = choose_vector_type(tcg_ctx, g->opt_opc, g->vece, oprsz, g->prefer_i64);
    }
    switch (type) {
    case TCG_TYPE_V256:
        /* Recall that ARM SVE allows vector sizes that are not a
         * power of 2, but always a multiple of 16.  The intent is
         * that e.g. size == 80 would be expanded with 2x32 + 1x16.
         */
        some = QEMU_ALIGN_DOWN(oprsz, 32);
        expand_2_vec(tcg_ctx, g->vece, dofs, aofs, some, 32, TCG_TYPE_V256, g->fniv);
        if (some == oprsz) {
            break;
        }
        dofs += some;
        aofs += some;
        oprsz -= some;
        maxsz -= some;
        /* fallthru */
    case TCG_TYPE_V128:
        expand_2_vec(tcg_ctx, g->vece, dofs, aofs, oprsz, 16, TCG_TYPE_V128, g->fniv);
        break;
    case TCG_TYPE_V64:
        expand_2_vec(tcg_ctx, g->vece, dofs, aofs, oprsz, 8, TCG_TYPE_V64, g->fniv);
        break;

    case 0:
        if (g->fni8 && check_size_impl(oprsz, 8)) {
            expand_2_i64(tcg_ctx, dofs, aofs, oprsz, g->fni8);
        } else if (g->fni4 && check_size_impl(oprsz, 4)) {
            expand_2_i32(tcg_ctx, dofs, aofs, oprsz, g->fni4);
        } else {
            assert(g->fno != NULL);
            tcg_gen_gvec_2_ool(tcg_ctx, dofs, aofs, oprsz, maxsz, g->data, g->fno);
            oprsz = maxsz;
        }
        break;

    default:
        g_assert_not_reached();
    }
    tcg_swap_vecop_list(hold_list);

    if (oprsz < maxsz) {
        expand_clr(tcg_ctx, dofs + oprsz, maxsz - oprsz);
    }
}